

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guardedTests.cpp
# Opt level: O2

void __thiscall guarded_guarded_1_Test::TestBody(guarded_guarded_1_Test *this)

{
  char *message;
  char *in_R9;
  atomic<bool> th3_ok;
  atomic<bool> th2_ok;
  atomic<bool> th1_ok;
  thread th1;
  AssertHelper local_b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  thread th2;
  handle data_handle;
  AssertionResult gtest_ar_;
  thread th3;
  handle data_handle_1;
  guarded<int,_std::timed_mutex> data;
  
  data.m_obj = 0;
  data.m_mutex.super___mutex_base._M_mutex.__align = 0;
  data.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  data.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  data.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  data.m_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  gmlc::libguarded::guarded<int,_std::timed_mutex>::lock(&data_handle,&data);
  *data_handle.data = *data_handle.data + 1;
  std::unique_lock<std::timed_mutex>::~unique_lock(&data_handle.m_handle_lock);
  gmlc::libguarded::guarded<int,_std::timed_mutex>::try_lock(&data_handle_1,&data);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  th1_ok._M_base._M_i = (__atomic_base<bool>)true;
  th2_ok._M_base._M_i = (__atomic_base<bool>)true;
  th3_ok._M_base._M_i = (__atomic_base<bool>)true;
  gtest_ar_.success_ = data_handle_1.data != (pointer)0x0;
  if (data_handle_1.data == (pointer)0x0) {
    testing::Message::Message((Message *)&th1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)0x1442d7,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guardedTests.cpp"
               ,0x2f,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th2,(Message *)&th1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th2);
    std::__cxx11::string::~string((string *)&data_handle);
    if (th1._M_id._M_thread != 0) {
      (**(code **)(*(long *)th1._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle,"*data_handle","1",data_handle_1.data,(int *)&gtest_ar_);
  if ((char)data_handle.data == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (data_handle.m_handle_lock._M_device == (mutex_type *)0x0) {
      message = "";
    }
    else {
      message = (char *)((data_handle.m_handle_lock._M_device)->super___mutex_base)._M_mutex.__align
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guardedTests.cpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th1,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th1);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data_handle.m_handle_lock);
  th1._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016b5c8;
  *(guarded<int,_std::timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th1_ok;
  std::thread::_M_start_thread(&th1,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th2._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016b608;
  *(guarded<int,_std::timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th2_ok;
  std::thread::_M_start_thread(&th2,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th3._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016b648;
  *(guarded<int,_std::timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th3_ok;
  std::thread::_M_start_thread(&th3,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th1_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th1_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th1_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guardedTests.cpp"
               ,0x50,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th2_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th2_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th2_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guardedTests.cpp"
               ,0x51,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th3_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th3_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th3_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guardedTests.cpp"
               ,0x52,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::thread::~thread(&th3);
  std::thread::~thread(&th2);
  std::thread::~thread(&th1);
  std::unique_lock<std::timed_mutex>::~unique_lock(&data_handle_1.m_handle_lock);
  return;
}

Assistant:

TEST(guarded, guarded_1)
{
    guarded<int, std::timed_mutex> data(0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.try_lock();

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        /* These tests must be done from another thread, because on
           glibc std::mutex is actually a recursive mutex. */

        std::thread th1([&data, &th1_ok]() {
            auto data_handle2 = data.try_lock();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&data, &th2_ok]() {
            auto data_handle2 =
                data.try_lock_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&data, &th3_ok]() {
            auto data_handle2 =
                data.try_lock_until(std::chrono::steady_clock::now() +
                                    std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();
        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }
}